

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O3

int coda_ascii_cursor_read_double(coda_cursor *cursor,double *dst)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  coda_type *pcVar9;
  char *pcVar10;
  size_t __n;
  long lVar11;
  size_t length;
  int64_t bit_size_boundary;
  char buffer [64];
  long local_80;
  char local_78 [72];
  
  pcVar9 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar9->format) {
    pcVar9 = *(coda_type **)&pcVar9->type_class;
  }
  uVar1 = cursor->stack[(long)cursor->n + -1].bit_offset;
  iVar4 = get_bit_size_boundary(cursor,&local_80,pcVar9->bit_size);
  iVar8 = -1;
  if (iVar4 == 0) {
    if ((uVar1 & 7) == 0) {
      uVar2 = pcVar9->bit_size;
      if ((long)uVar2 < 0) {
        length = 0x40;
        if (local_80 >> 3 < 0x40) {
          length = local_80 >> 3;
        }
        iVar4 = 1;
      }
      else {
        if (0x207 < uVar2) {
          __assert_fail("buffer_size <= MAX_ASCII_NUMBER_LENGTH",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                        ,0x523,"int coda_ascii_cursor_read_double(const coda_cursor *, double *)");
        }
        length = uVar2 >> 3;
        iVar4 = 0;
      }
      iVar5 = read_bytes_in_bounds(cursor->product,(long)uVar1 >> 3,length,local_78);
      if (iVar5 == 0) {
        pcVar10 = pcVar9[1].description;
        if ((pcVar10 != (char *)0x0) && (iVar5 = *(int *)(pcVar10 + 8), 0 < (long)iVar5)) {
          lVar7 = *(long *)(pcVar10 + 0x10);
          lVar11 = 0;
          do {
            piVar3 = *(int **)(lVar7 + lVar11 * 8);
            __n = (size_t)*piVar3;
            if (__n == 0) {
              if (length == 0) goto LAB_00143811;
            }
            else if (((long)__n <= (long)length) &&
                    (iVar6 = bcmp(*(void **)(piVar3 + 2),local_78,__n), iVar6 == 0)) {
              if (((long)uVar2 < 0) || (length == __n)) {
LAB_00143811:
                *dst = *(double *)(piVar3 + 4);
                return 0;
              }
              pcVar10 = "invalid format for ascii float";
              iVar4 = -0x67;
              goto LAB_001436f8;
            }
            lVar11 = lVar11 + 1;
          } while (iVar5 != lVar11);
        }
        lVar7 = coda_ascii_parse_double(local_78,length,dst,iVar4);
        iVar8 = (int)(lVar7 >> 0x3f);
      }
    }
    else {
      pcVar10 = "reading of ascii data does not start at byte boundary";
      iVar4 = -0x16;
LAB_001436f8:
      coda_set_error(iVar4,pcVar10);
    }
  }
  return iVar8;
}

Assistant:

int coda_ascii_cursor_read_double(const coda_cursor *cursor, double *dst)
{
    coda_type_number *type = (coda_type_number *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t bit_size_boundary;
    char buffer[MAX_ASCII_NUMBER_LENGTH];
    long buffer_size;
    int has_dynamic_size = 1;

    if (get_bit_size_boundary(cursor, &bit_size_boundary, type->bit_size) != 0)
    {
        return -1;
    }

    if (bit_offset & 0x7)
    {
        coda_set_error(CODA_ERROR_FILE_READ, "reading of ascii data does not start at byte boundary");
        return -1;
    }

    if (type->bit_size >= 0)
    {
        has_dynamic_size = 0;
        buffer_size = (long)(type->bit_size >> 3);
        assert(buffer_size <= MAX_ASCII_NUMBER_LENGTH);
    }
    else if (bit_size_boundary >> 3 < MAX_ASCII_NUMBER_LENGTH)
    {
        buffer_size = (long)(bit_size_boundary >> 3);
    }
    else
    {
        buffer_size = MAX_ASCII_NUMBER_LENGTH;
    }

    if (read_bytes_in_bounds(cursor->product, bit_offset >> 3, buffer_size, buffer) != 0)
    {
        return -1;
    }
    if (type->mappings != NULL)
    {
        switch (parse_float_mapping(buffer, buffer_size, type->mappings, has_dynamic_size, dst))
        {
            case 0:
                /* no mapping applied */
                break;
            case 1:
                /* applicable mapping found */
                return 0;
            default:
                return -1;
        }
    }
    if (coda_ascii_parse_double(buffer, buffer_size, dst, has_dynamic_size) < 0)
    {
        return -1;
    }

    return 0;
}